

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

void secp256k1_fe_negate(secp256k1_fe *r,secp256k1_fe *a,int m)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(m + 1);
  r->n[0] = uVar2 * 0x1ffffdfffff85e - a->n[0];
  lVar1 = uVar2 * 0x1ffffffffffffe;
  r->n[1] = lVar1 - a->n[1];
  r->n[2] = lVar1 - a->n[2];
  r->n[3] = lVar1 - a->n[3];
  r->n[4] = uVar2 * 0x1fffffffffffe - a->n[4];
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_negate(secp256k1_fe *r, const secp256k1_fe *a, int m) {
#ifdef VERIFY
    VERIFY_CHECK(a->magnitude <= m);
    secp256k1_fe_verify(a);
#endif
    r->n[0] = 0xFFFFEFFFFFC2FULL * 2 * (m + 1) - a->n[0];
    r->n[1] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[1];
    r->n[2] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[2];
    r->n[3] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[3];
    r->n[4] = 0x0FFFFFFFFFFFFULL * 2 * (m + 1) - a->n[4];
#ifdef VERIFY
    r->magnitude = m + 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
#endif
}